

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

bool testing::internal::ParseInt32(Message *src_text,char *str,Int32 *value)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  ostream *poVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar5;
  String SVar6;
  char *end;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  void *local_38 [2];
  char *local_28;
  
  local_28 = (char *)0x0;
  lVar1 = strtol(str,&local_28,10);
  if (*local_28 == '\0') {
    if ((int)lVar1 == lVar1) {
      *value = (int)lVar1;
      return true;
    }
    Message::Message((Message *)&local_40);
    poVar4 = (ostream *)(local_40.ptr_ + 0x10);
    if (local_40.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"WARNING: ",9);
    poVar4 = (ostream *)(local_40.ptr_ + 0x10);
    if (local_40.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    testing::operator<<(poVar4,src_text);
    poVar4 = (ostream *)(local_40.ptr_ + 0x10);
    if (local_40.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," is expected to be a 32-bit integer, but actually",0x31);
    poVar4 = (ostream *)(local_40.ptr_ + 0x10);
    if (local_40.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," has value ",0xb);
    if (str == (char *)0x0) {
      sVar5.ptr_ = local_40.ptr_ + 0x10;
      sVar2 = 6;
      str = "(null)";
    }
    else {
      sVar5.ptr_ = local_40.ptr_;
      if (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_40.ptr_ + 0x10);
      }
      sVar2 = strlen(str);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,str,sVar2);
    poVar4 = (ostream *)(local_40.ptr_ + 0x10);
    if (local_40.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", which overflows.\n",0x13);
    SVar6 = StringStreamToString((internal *)local_38,local_40.ptr_);
    sVar3 = SVar6.length_;
  }
  else {
    Message::Message((Message *)&local_40);
    poVar4 = (ostream *)(local_40.ptr_ + 0x10);
    if (local_40.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"WARNING: ",9);
    poVar4 = (ostream *)(local_40.ptr_ + 0x10);
    if (local_40.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    testing::operator<<(poVar4,src_text);
    poVar4 = (ostream *)(local_40.ptr_ + 0x10);
    if (local_40.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," is expected to be a 32-bit integer, but actually",0x31);
    poVar4 = (ostream *)(local_40.ptr_ + 0x10);
    if (local_40.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," has value \"",0xc);
    if (str == (char *)0x0) {
      sVar5.ptr_ = local_40.ptr_ + 0x10;
      sVar2 = 6;
      str = "(null)";
    }
    else {
      sVar5.ptr_ = local_40.ptr_;
      if (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_40.ptr_ + 0x10);
      }
      sVar2 = strlen(str);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,str,sVar2);
    poVar4 = (ostream *)(local_40.ptr_ + 0x10);
    if (local_40.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".\n",3);
    SVar6 = StringStreamToString((internal *)local_38,local_40.ptr_);
    sVar3 = SVar6.length_;
  }
  printf("%s",local_38[0],sVar3);
  if (local_38[0] != (void *)0x0) {
    operator_delete__(local_38[0]);
  }
  fflush(_stdout);
  if (local_40.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_40.ptr_ + 8))();
  }
  return false;
}

Assistant:

bool ParseInt32(const Message& src_text, const char* str, Int32* value) {
  // Parses the environment variable as a decimal integer.
  char* end = NULL;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value \"" << str << "\".\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  // Is the parsed value in the range of an Int32?
  const Int32 result = static_cast<Int32>(long_value);
  if (long_value == LONG_MAX || long_value == LONG_MIN ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
      // The parsed value overflows as an Int32.
      ) {
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value " << str << ", which overflows.\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  *value = result;
  return true;
}